

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

void __thiscall
slang::syntax::ForVariableDeclarationSyntax::setChild
          (ForVariableDeclarationSyntax *this,size_t index,TokenOrSyntax child)

{
  SyntaxNode *pSVar1;
  long in_RSI;
  long in_RDI;
  Token TVar2;
  ConstTokenOrSyntax *in_stack_ffffffffffffffa8;
  DataTypeSyntax *local_50;
  DeclaratorSyntax *local_30;
  not_null<slang::syntax::DeclaratorSyntax_*> local_28;
  undefined8 local_20;
  Info *local_18;
  
  if (in_RSI == 0) {
    TVar2 = ConstTokenOrSyntax::token(in_stack_ffffffffffffffa8);
    local_20 = TVar2._0_8_;
    *(undefined8 *)(in_RDI + 0x18) = local_20;
    local_18 = TVar2.info;
    *(Info **)(in_RDI + 0x20) = local_18;
  }
  else if (in_RSI == 1) {
    pSVar1 = TokenOrSyntax::node((TokenOrSyntax *)0x39addf);
    if (pSVar1 == (SyntaxNode *)0x0) {
      local_50 = (DataTypeSyntax *)0x0;
    }
    else {
      pSVar1 = TokenOrSyntax::node((TokenOrSyntax *)0x39adef);
      local_50 = SyntaxNode::as<slang::syntax::DataTypeSyntax>(pSVar1);
    }
    *(DataTypeSyntax **)(in_RDI + 0x28) = local_50;
  }
  else {
    pSVar1 = TokenOrSyntax::node((TokenOrSyntax *)0x39ae21);
    if (pSVar1 == (SyntaxNode *)0x0) {
      local_30 = (DeclaratorSyntax *)0x0;
    }
    else {
      pSVar1 = TokenOrSyntax::node((TokenOrSyntax *)0x39ae31);
      local_30 = SyntaxNode::as<slang::syntax::DeclaratorSyntax>(pSVar1);
    }
    not_null<slang::syntax::DeclaratorSyntax_*>::not_null<slang::syntax::DeclaratorSyntax_*>
              (&local_28,&local_30);
    *(DeclaratorSyntax **)(in_RDI + 0x30) = local_28.ptr;
  }
  return;
}

Assistant:

void ForVariableDeclarationSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: varKeyword = child.token(); return;
        case 1: type = child.node() ? &child.node()->as<DataTypeSyntax>() : nullptr; return;
        case 2: declarator = child.node() ? &child.node()->as<DeclaratorSyntax>() : nullptr; return;
        default: SLANG_UNREACHABLE;
    }
}